

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O0

void onig_regset_free(OnigRegSet *set)

{
  OnigRegion *r;
  OnigRegion *region;
  regex_t *reg;
  int i;
  OnigRegSet *set_local;
  
  for (reg._4_4_ = 0; reg._4_4_ < set->n; reg._4_4_ = reg._4_4_ + 1) {
    r = set->rs[reg._4_4_].region;
    onig_free(set->rs[reg._4_4_].reg);
    if (r != (OnigRegion *)0x0) {
      onig_region_free(r,1);
    }
  }
  free(set->rs);
  free(set);
  return;
}

Assistant:

extern void
onig_regset_free(OnigRegSet* set)
{
  int i;

  for (i = 0; i < set->n; i++) {
    regex_t* reg;
    OnigRegion* region;

    reg    = set->rs[i].reg;
    region = set->rs[i].region;
    onig_free(reg);
    if (IS_NOT_NULL(region))
      onig_region_free(region, 1);
  }

  xfree(set->rs);
  xfree(set);
}